

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_indirect_string.cpp
# Opt level: O0

void __thiscall
IndirectString_StoreRoundTrip_Test::~IndirectString_StoreRoundTrip_Test
          (IndirectString_StoreRoundTrip_Test *this)

{
  IndirectString_StoreRoundTrip_Test *this_local;
  
  ~IndirectString_StoreRoundTrip_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (IndirectString, StoreRoundTrip) {
    constexpr auto str = "string";

    auto const pointer_addr = [this, str] () -> pstore::address {
        // Create a transaction.
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});

        // Construct the string and the indirect string. Write the indirect pointer to the store.
        pstore::raw_sstring_view const sstring = pstore::make_sstring_view (str);
        pstore::indirect_string indirect{db_, &sstring};
        auto const indirect_addr = pstore::serialize::write (
            pstore::serialize::archive::make_writer (transaction), indirect);
        EXPECT_EQ (transaction.size (), sizeof (pstore::address));

        // Now the body of the string (and patch the pointer).
        pstore::indirect_string::write_body_and_patch_address (
            transaction, sstring, pstore::typed_address<pstore::address> (indirect_addr));

        // Commit the transaction.
        transaction.commit ();
        return indirect_addr;
    }();

    auto const ind2 = pstore::serialize::read<pstore::indirect_string> (
        pstore::serialize::archive::make_reader (db_, pointer_addr));

    pstore::shared_sstring_view owner;
    EXPECT_EQ (ind2.as_string_view (&owner), pstore::make_sstring_view (str));

    // check the 'get_sstring_view' helper function.
    EXPECT_EQ (get_sstring_view (db_, pstore::typed_address<pstore::indirect_string> (pointer_addr),
                                 &owner),
               pstore::make_sstring_view (str));

    EXPECT_EQ (get_sstring_view (db_, ind2.in_store_address (), &owner),
               pstore::make_sstring_view (str));
    EXPECT_EQ (get_sstring_view (db_, ind2.in_store_address (), std::strlen (str), &owner),
               pstore::make_sstring_view (str));
}